

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ColumnDefault(Vdbe *v,Table *pTab,int i,int iReg)

{
  long lVar1;
  sqlite3 *psVar2;
  int in_EDX;
  Table *in_RSI;
  Vdbe *in_RDI;
  long in_FS_OFFSET;
  u8 enc;
  Column *pCol;
  sqlite3_value *pValue;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  sqlite3 *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  u8 uVar3;
  sqlite3 *db;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  db = (sqlite3 *)(in_RSI->aCol + in_EDX);
  if (*(u16 *)((long)&db->pVdbe + 4) != 0) {
    psVar2 = sqlite3VdbeDb(in_RDI);
    uVar3 = psVar2->enc;
    in_stack_ffffffffffffffc0 = sqlite3VdbeDb(in_RDI);
    sqlite3ColumnExpr(in_RSI,(Column *)db);
    sqlite3ValueFromExpr
              (db,(Expr *)CONCAT17(uVar3,in_stack_ffffffffffffffc8),
               (u8)((ulong)in_stack_ffffffffffffffc0 >> 0x38),
               (u8)((ulong)in_stack_ffffffffffffffc0 >> 0x30),
               (sqlite3_value **)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  if ((*(char *)((long)&db->pVdbe + 1) == 'E') && (in_RSI->eTabType != '\x01')) {
    sqlite3VdbeAddOp1((Vdbe *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                      in_stack_ffffffffffffffb8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ColumnDefault(Vdbe *v, Table *pTab, int i, int iReg){
  Column *pCol;
  assert( pTab!=0 );
  assert( pTab->nCol>i );
  pCol = &pTab->aCol[i];
  if( pCol->iDflt ){
    sqlite3_value *pValue = 0;
    u8 enc = ENC(sqlite3VdbeDb(v));
    assert( !IsView(pTab) );
    VdbeComment((v, "%s.%s", pTab->zName, pCol->zCnName));
    assert( i<pTab->nCol );
    sqlite3ValueFromExpr(sqlite3VdbeDb(v),
                         sqlite3ColumnExpr(pTab,pCol), enc,
                         pCol->affinity, &pValue);
    if( pValue ){
      sqlite3VdbeAppendP4(v, pValue, P4_MEM);
    }
  }
#ifndef SQLITE_OMIT_FLOATING_POINT
  if( pCol->affinity==SQLITE_AFF_REAL && !IsVirtual(pTab) ){
    sqlite3VdbeAddOp1(v, OP_RealAffinity, iReg);
  }
#endif
}